

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_helpers.cc
# Opt level: O3

string * google::protobuf::compiler::java::ToCamelCase
                   (string *__return_storage_ptr__,string *input,bool lower_first)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  char *pcVar4;
  char cVar5;
  size_type sVar6;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  sVar2 = input->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (input->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      if (pcVar3[sVar6] != '_') {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  if ((lower_first) && (__return_storage_ptr__->_M_string_length != 0)) {
    pcVar4 = (__return_storage_ptr__->_M_dataplus)._M_p;
    cVar1 = *pcVar4;
    cVar5 = cVar1 + ' ';
    if (0x19 < (byte)(cVar1 + 0xbfU)) {
      cVar5 = cVar1;
    }
    *pcVar4 = cVar5;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ToCamelCase(const std::string& input, bool lower_first) {
  bool capitalize_next = !lower_first;
  std::string result;
  result.reserve(input.size());

  for (char i : input) {
    if (i == '_') {
      capitalize_next = true;
    } else if (capitalize_next) {
      result.push_back(ToUpperCh(i));
      capitalize_next = false;
    } else {
      result.push_back(i);
    }
  }

  // Lower-case the first letter.
  if (lower_first && !result.empty()) {
    result[0] = ToLowerCh(result[0]);
  }

  return result;
}